

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,String *first,ArrayPtr<const_char> *rest,
          ArrayPtr<const_char> *rest_1,ArrayPtr<const_char> *rest_2,CappedArray<char,_14UL> *rest_3,
          ArrayPtr<const_char> *rest_4,StringTree *rest_5,ArrayPtr<const_char> *rest_6,
          String *rest_7,ArrayPtr<const_char> *rest_8,ArrayPtr<const_char> *rest_9,
          ArrayPtr<const_char> *rest_10,CappedArray<char,_14UL> *rest_11,
          ArrayPtr<const_char> *rest_12)

{
  char *pcVar1;
  StringTree local_68;
  
  pcVar1 = (char *)(this->text).content.size_;
  if (pcVar1 != (char *)0x0) {
    pcVar1 = (this->text).content.ptr;
  }
  (this->branches).ptr[branchIndex].index = (long)pos - (long)pcVar1;
  local_68.text.content.size_ = (first->content).size_;
  local_68.size_ = 0;
  if (local_68.text.content.size_ != 0) {
    local_68.size_ = local_68.text.content.size_ - 1;
  }
  local_68.text.content.ptr = (first->content).ptr;
  local_68.text.content.disposer = (first->content).disposer;
  (first->content).ptr = (char *)0x0;
  (first->content).size_ = 0;
  local_68.branches.disposer = (ArrayDisposer *)0x0;
  local_68.branches.ptr = (Branch *)0x0;
  local_68.branches.size_ = 0;
  operator=(&(this->branches).ptr[branchIndex].content,&local_68);
  ~StringTree(&local_68);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,rest,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8,
             rest_9,rest_10,rest_11,rest_12);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, String&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = StringTree(kj::mv(first));
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}